

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O2

void unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
               (rt_unary_expr<viennamath::rt_expression_interface<double>_> *e,double ref_solution)

{
  uint __line;
  ostream *poVar1;
  char *__assertion;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  numeric_type nVar2;
  vector<double,_std::allocator<double>_> p;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_130;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_118;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_100;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_e8;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_d0;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_b8;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_a0;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_78;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_50;
  
  std::vector<double,_std::allocator<double>_>::vector(&p,3,(allocator_type *)&local_a0);
  *p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       4.0;
  p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[1]
       = 6.0;
  p.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[2]
       = 8.0;
  poVar1 = viennamath::operator<<((ostream *)&std::cout,e);
  std::operator<<(poVar1," at STL (");
  poVar1 = std::ostream::_M_insert<double>
                     (*p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>
                     (p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[1]);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>
                     (p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[2]);
  poVar1 = std::operator<<(poVar1,")");
  std::operator<<(poVar1," = ");
  (*(e->super_rt_expression_interface<double>)._vptr_rt_expression_interface[5])(e,&p);
  poVar1 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
  std::operator<<(poVar1," = ");
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::rt_unary_expr
            (&local_b8,e);
  (*local_b8.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])(&local_b8,&p);
  poVar1 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
  std::operator<<(poVar1," (reference solution: ");
  poVar1 = std::ostream::_M_insert<double>(ref_solution);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr(&local_b8)
  ;
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::rt_unary_expr
            (&local_d0,e);
  (*local_d0.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])(&local_d0,&p);
  if (ref_solution <= extraout_XMM0_Qa_01) {
    viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::rt_unary_expr
              (&local_e8,e);
    (*local_e8.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])(&local_e8,&p)
    ;
    if (extraout_XMM0_Qa_02 <= ref_solution) {
      viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr
                (&local_e8);
      viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr
                (&local_d0);
      poVar1 = viennamath::operator<<((ostream *)&std::cout,e);
      poVar1 = std::operator<<(poVar1," at vector_3 (");
      local_a0.t0_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_001333a8;
      local_a0.t0_.s = 4.0;
      local_a0.t1_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_00133468;
      local_a0.t1_.s = 6;
      poVar1 = viennamath::operator<<(poVar1,&local_a0);
      poVar1 = std::operator<<(poVar1,")");
      std::operator<<(poVar1," = ");
      local_78.t0_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_001333a8;
      local_78.t0_.s = 4.0;
      local_78.t1_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_00133468;
      local_78.t1_.s = 6;
      nVar2 = viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>::operator()
                        ((rt_unary_expr<viennamath::rt_expression_interface<double>> *)e,&local_78);
      poVar1 = std::ostream::_M_insert<double>(nVar2);
      std::operator<<(poVar1," = ");
      viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::rt_unary_expr
                (&local_100,e);
      local_50.t0_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_001333a8;
      local_50.t0_.s = 4.0;
      local_50.t1_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_00133468;
      local_50.t1_.s = 6;
      nVar2 = viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>::operator()
                        ((rt_unary_expr<viennamath::rt_expression_interface<double>> *)&local_100,
                         &local_50);
      poVar1 = std::ostream::_M_insert<double>(nVar2);
      std::operator<<(poVar1," (reference solution: ");
      poVar1 = std::ostream::_M_insert<double>(ref_solution);
      poVar1 = std::operator<<(poVar1,")");
      std::endl<char,std::char_traits<char>>(poVar1);
      viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr
                (&local_100);
      viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::rt_unary_expr
                (&local_118,e);
      local_a0.t0_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_001333a8;
      local_a0.t0_.s = 4.0;
      local_a0.t1_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_00133468;
      local_a0.t1_.s = 6;
      nVar2 = viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>::operator()
                        ((rt_unary_expr<viennamath::rt_expression_interface<double>> *)&local_118,
                         &local_a0);
      if (nVar2 <= ref_solution) {
        viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::rt_unary_expr
                  (&local_130,e);
        local_78.t0_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
             (_func_int **)&PTR__rt_expression_interface_001333a8;
        local_78.t0_.s = 4.0;
        local_78.t1_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
             (_func_int **)&PTR__rt_expression_interface_00133468;
        local_78.t1_.s = 6;
        nVar2 = viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>::operator()
                          ((rt_unary_expr<viennamath::rt_expression_interface<double>> *)&local_130,
                           &local_78);
        if (ref_solution <= nVar2) {
          viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr
                    (&local_130);
          viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr
                    (&local_118);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&p.super__Vector_base<double,_std::allocator<double>_>);
          return;
        }
      }
      __assertion = 
      "viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) <= ref_solution && viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) >= ref_solution"
      ;
      __line = 0x66;
      goto LAB_00125abb;
    }
  }
  __assertion = "viennamath::eval(e, p) >= ref_solution && viennamath::eval(e, p) <= ref_solution";
  __line = 0x60;
LAB_00125abb:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/tests/src/runtime_test.cpp"
                ,__line,"void unary_test(const E &, double) [E = viennamath::rt_unary_expr<>]");
}

Assistant:

void unary_test(E const & e, double ref_solution)
{
  viennamath::rt_constant<double> c4(4.0);
  viennamath::rt_constant<long> c6(6);
  viennamath::ct_constant<8> c8;

  std::vector<double> p(3);
  p[0] = 4;
  p[1] = 6;
  p[2] = 8;

  std::cout << e << " at STL (" << p[0] << ", " << p[1] << ", " << p[2] << ")"
            << " = " << e(p)
            << " = " << viennamath::eval(e,p)
            << " (reference solution: " << ref_solution << ")" << std::endl;
  assert(viennamath::eval(e, p) >= ref_solution && viennamath::eval(e, p) <= ref_solution);

  std::cout << e << " at vector_3 (" << viennamath::make_vector(c4, c6, c8) << ")"
            << " = " << e(viennamath::make_vector(c4, c6, c8))
            << " = " << viennamath::eval(e, viennamath::make_vector(c4, c6, c8))
            << " (reference solution: " << ref_solution << ")" << std::endl;
  assert(viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) <= ref_solution && viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) >= ref_solution);
}